

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

optional<const_google::protobuf::Message_*> __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::FindInTypeMap
          (GeneratedMessageFactory *this,Descriptor *type)

{
  ctrl_t *ctrl;
  _Storage<const_google::protobuf::Message_*,_true> _Var1;
  reference ppVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  optional<const_google::protobuf::Message_*> oVar4;
  iterator it;
  iterator local_40;
  Descriptor *local_30;
  iterator local_28;
  undefined7 extraout_var;
  
  local_30 = type;
  local_40 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
             ::find<google::protobuf::Descriptor_const*>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
                         *)&this->type_map_,&local_30);
  ctrl = local_40.ctrl_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
              *)&this->type_map_);
  local_28.ctrl_ = (ctrl_t *)0x0;
  _Var1._0_1_ = absl::lts_20250127::container_internal::operator==(&local_40,&local_28);
  _Var1._1_7_ = extraout_var;
  if (_Var1._0_1_) {
    uVar3 = 0;
  }
  else {
    absl::lts_20250127::container_internal::AssertIsFull
              (ctrl,'\0',(GenerationType *)0x0,"operator->");
    ppVar2 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
             ::iterator::operator*(&local_40);
    _Var1 = (_Storage<const_google::protobuf::Message_*,_true>)(ppVar2->second).value_;
    uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  oVar4.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::Message_*>._8_8_ = uVar3;
  oVar4.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload =
       (_Storage<const_google::protobuf::Message_*,_true>)
       (_Storage<const_google::protobuf::Message_*,_true>)_Var1._M_value;
  return (optional<const_google::protobuf::Message_*>)
         oVar4.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
         super__Optional_payload_base<const_google::protobuf::Message_*>;
}

Assistant:

ABSL_SHARED_LOCKS_REQUIRED(mutex_)
  {
    auto it = type_map_.find(type);
    if (it == type_map_.end()) return absl::nullopt;
    return it->second.get();
  }